

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall TTD::MarkTable::InitializeIter(MarkTable *this)

{
  MarkTable *this_local;
  
  this->m_iterPos = 0;
  if (*this->m_markArray == Clear) {
    MoveToNextAddress(this);
  }
  return;
}

Assistant:

void InitializeIter()
        {
            this->m_iterPos = 0;

            if (this->m_markArray[0] == MarkTableTag::Clear)
            {
                this->MoveToNextAddress();
            }
        }